

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# applications_pool.cpp
# Opt level: O0

void __thiscall
cppcms::application_specific_pool::~application_specific_pool(application_specific_pool *this)

{
  noncopyable *in_RDI;
  
  *(undefined ***)in_RDI = &PTR__application_specific_pool_0052b468;
  booster::hold_ptr<cppcms::application_specific_pool::_data>::~hold_ptr
            ((hold_ptr<cppcms::application_specific_pool::_data> *)in_RDI);
  std::enable_shared_from_this<cppcms::application_specific_pool>::~enable_shared_from_this
            ((enable_shared_from_this<cppcms::application_specific_pool> *)0x3a9518);
  booster::noncopyable::~noncopyable(in_RDI);
  return;
}

Assistant:

application_specific_pool::~application_specific_pool()
{
}